

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void duckdb_re2::PrefixSuccessor(string *prefix)

{
  byte bVar1;
  char *pcVar2;
  char *c;
  
  while( true ) {
    bVar1 = std::__cxx11::string::empty();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      return;
    }
    pcVar2 = (char *)std::__cxx11::string::back();
    if (*pcVar2 != -1) break;
    std::__cxx11::string::pop_back();
  }
  *pcVar2 = *pcVar2 + '\x01';
  return;
}

Assistant:

void PrefixSuccessor(std::string* prefix) {
  // We can increment the last character in the string and be done
  // unless that character is 255, in which case we have to erase the
  // last character and increment the previous character, unless that
  // is 255, etc. If the string is empty or consists entirely of
  // 255's, we just return the empty string.
  while (!prefix->empty()) {
    char& c = prefix->back();
    if (c == '\xff') {  // char literal avoids signed/unsigned.
      prefix->pop_back();
    } else {
      ++c;
      break;
    }
  }
}